

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  FieldDescriptor *this_00;
  bool bVar3;
  Label LVar4;
  CppType CVar5;
  uint uVar6;
  uint32 uVar7;
  Type TVar8;
  protobuf *ppVar9;
  char *pcVar10;
  Params *params_00;
  EnumValueDescriptor *this_01;
  string *input;
  LogMessage *other;
  uint *descriptor;
  int i;
  int i_00;
  long i_01;
  long i_02;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  allocator local_17a;
  LogFinisher local_179;
  LogMessage local_178;
  allocator local_139;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  allocator local_af;
  allocator local_ae;
  allocator local_ad;
  float local_ac;
  undefined1 local_a8 [4];
  float value_1;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  double local_80;
  double value;
  string local_58;
  allocator local_35 [20];
  allocator local_21;
  Params *local_20;
  FieldDescriptor *field_local;
  Params *params_local;
  
  local_20 = params;
  field_local = (FieldDescriptor *)this;
  params_local = (Params *)__return_storage_ptr__;
  LVar4 = FieldDescriptor::label((FieldDescriptor *)params);
  if (LVar4 == LABEL_REPEATED) {
    EmptyArrayName_abi_cxx11_(__return_storage_ptr__,(javanano *)field_local,local_20,field);
  }
  else {
    bVar3 = Params::use_reference_types_for_primitives((Params *)field_local);
    if (bVar3) {
      bVar3 = Params::reftypes_primitive_enums((Params *)field_local);
      if ((bVar3) &&
         (CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)local_20), CVar5 == CPPTYPE_ENUM)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"Integer.MIN_VALUE",&local_21)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_21);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"null",local_35);
        std::allocator<char>::~allocator((allocator<char> *)local_35);
      }
    }
    else {
      CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)local_20);
      this_00 = field_local;
      descriptor = &switchD_00390078::switchdataD_005d4074;
      switch(CVar5) {
      case CPPTYPE_INT32:
        uVar6 = FieldDescriptor::default_value_int32((FieldDescriptor *)local_20);
        SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i);
        break;
      case CPPTYPE_INT64:
        ppVar9 = (protobuf *)FieldDescriptor::default_value_int64((FieldDescriptor *)local_20);
        SimpleItoa_abi_cxx11_(&local_58,ppVar9,i_01);
        std::operator+(__return_storage_ptr__,&local_58,"L");
        std::__cxx11::string::~string((string *)&local_58);
        break;
      case CPPTYPE_UINT32:
        uVar7 = FieldDescriptor::default_value_uint32((FieldDescriptor *)local_20);
        SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar7,i_00);
        break;
      case CPPTYPE_UINT64:
        ppVar9 = (protobuf *)FieldDescriptor::default_value_uint64((FieldDescriptor *)local_20);
        SimpleItoa_abi_cxx11_((string *)&value,ppVar9,i_02);
        std::operator+(__return_storage_ptr__,(string *)&value,"L");
        std::__cxx11::string::~string((string *)&value);
        break;
      case CPPTYPE_DOUBLE:
        dVar13 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
        local_80 = dVar13;
        dVar14 = std::numeric_limits<double>::infinity();
        dVar2 = local_80;
        if ((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) {
          dVar13 = std::numeric_limits<double>::infinity();
          if ((dVar2 != -dVar13) || (NAN(dVar2) || NAN(-dVar13))) {
            if (NAN(local_80)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"Double.NaN",&local_83);
              std::allocator<char>::~allocator((allocator<char> *)&local_83);
            }
            else {
              SimpleDtoa_abi_cxx11_((string *)local_a8,(protobuf *)this,local_80);
              std::operator+(__return_storage_ptr__,(string *)local_a8,"D");
              std::__cxx11::string::~string((string *)local_a8);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"Double.NEGATIVE_INFINITY",&local_82);
            std::allocator<char>::~allocator((allocator<char> *)&local_82);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"Double.POSITIVE_INFINITY",&local_81);
          std::allocator<char>::~allocator((allocator<char> *)&local_81);
        }
        break;
      case CPPTYPE_FLOAT:
        fVar11 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
        local_ac = fVar11;
        fVar12 = std::numeric_limits<float>::infinity();
        fVar1 = local_ac;
        if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
          fVar11 = std::numeric_limits<float>::infinity();
          if ((fVar1 != -fVar11) || (NAN(fVar1) || NAN(-fVar11))) {
            if (NAN(local_ac)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"Float.NaN",&local_af);
              std::allocator<char>::~allocator((allocator<char> *)&local_af);
            }
            else {
              SimpleFtoa_abi_cxx11_(&local_d0,(protobuf *)this,local_ac);
              std::operator+(__return_storage_ptr__,&local_d0,"F");
              std::__cxx11::string::~string((string *)&local_d0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"Float.NEGATIVE_INFINITY",&local_ae);
            std::allocator<char>::~allocator((allocator<char> *)&local_ae);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"Float.POSITIVE_INFINITY",&local_ad);
          std::allocator<char>::~allocator((allocator<char> *)&local_ad);
        }
        break;
      case CPPTYPE_BOOL:
        bVar3 = FieldDescriptor::default_value_bool((FieldDescriptor *)local_20);
        pcVar10 = "false";
        if (bVar3) {
          pcVar10 = "true";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar10,&local_d1);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        break;
      case CPPTYPE_ENUM:
        params_00 = (Params *)FieldDescriptor::enum_type((FieldDescriptor *)local_20);
        ClassName_abi_cxx11_(&local_118,(javanano *)this_00,params_00,(EnumDescriptor *)descriptor);
        std::operator+(&local_f8,&local_118,".");
        this_01 = FieldDescriptor::default_value_enum((FieldDescriptor *)local_20);
        input = EnumValueDescriptor::name_abi_cxx11_(this_01);
        RenameJavaKeywords(&local_138,input);
        std::operator+(__return_storage_ptr__,&local_f8,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        break;
      case CPPTYPE_STRING:
        FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)local_20);
        auVar15 = std::__cxx11::string::empty();
        if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          FieldDefaultConstantName_abi_cxx11_
                    (__return_storage_ptr__,(javanano *)local_20,auVar15._8_8_);
        }
        else {
          TVar8 = FieldDescriptor::type((FieldDescriptor *)local_20);
          if (TVar8 == TYPE_BYTES) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,
                       "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES",&local_d2);
            std::allocator<char>::~allocator((allocator<char> *)&local_d2);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"\"\"",&local_d3);
            std::allocator<char>::~allocator((allocator<char> *)&local_d3);
          }
        }
        break;
      case CPPTYPE_MESSAGE:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_139);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        break;
      default:
        internal::LogMessage::LogMessage
                  (&local_178,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
                   ,0x1de);
        other = internal::LogMessage::operator<<(&local_178,"Can\'t get here.");
        internal::LogFinisher::operator=(&local_179,other);
        internal::LogMessage::~LogMessage(&local_178);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_17a);
        std::allocator<char>::~allocator((allocator<char> *)&local_17a);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const Params& params, const FieldDescriptor* field) {
  if (field->label() == FieldDescriptor::LABEL_REPEATED) {
    return EmptyArrayName(params, field);
  }

  if (params.use_reference_types_for_primitives()) {
    if (params.reftypes_primitive_enums()
          && field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      return "Integer.MIN_VALUE";
    }
    return "null";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (!field->default_value_string().empty()) {
        // Point it to the static final in the generated code.
        return FieldDefaultConstantName(field);
      } else {
        if (field->type() == FieldDescriptor::TYPE_BYTES) {
          return "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES";
        } else {
          return "\"\"";
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(params, field->enum_type()) + "." +
             RenameJavaKeywords(field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}